

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_PrintHashTable(CloudManager *dd)

{
  int local_14;
  int i;
  CloudManager *dd_local;
  
  for (local_14 = 0; local_14 < dd->nNodesAlloc; local_14 = local_14 + 1) {
    if (dd->tUnique[local_14].v == 0xfffffff) {
      printf("-");
    }
    else {
      printf("+");
    }
  }
  printf("\n");
  return;
}

Assistant:

void Cloud_PrintHashTable( CloudManager * dd )
{
    int i;

    for ( i = 0; i < dd->nNodesAlloc; i++ )
        if ( dd->tUnique[i].v == CLOUD_CONST_INDEX )
            printf( "-" );
        else
            printf( "+" );
    printf( "\n" );
}